

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

bool TldAddressAsKey::CompareByAddressAndTld(TldAddressAsKey *x,TldAddressAsKey *y)

{
  size_t __n;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong __n_00;
  bool bVar4;
  
  __n = x->addr_len;
  bVar4 = y->addr_len < __n;
  if (__n == y->addr_len) {
    iVar3 = memcmp(x->addr,y->addr,__n);
    bVar4 = true;
    if (iVar3 < 1) {
      if (iVar3 == 0) {
        uVar1 = x->tld_len;
        uVar2 = y->tld_len;
        __n_00 = uVar1;
        if (uVar2 < uVar1) {
          __n_00 = uVar2;
        }
        iVar3 = memcmp(x->tld,y->tld,__n_00);
        if (iVar3 < 1) {
          bVar4 = iVar3 == 0 && uVar2 < uVar1;
        }
      }
      else {
        bVar4 = false;
      }
    }
  }
  return bVar4;
}

Assistant:

bool TldAddressAsKey::CompareByAddressAndTld(TldAddressAsKey * x, TldAddressAsKey * y)
{
    bool ret = x->addr_len > y->addr_len;

    if (x->addr_len == y->addr_len)
    {
        int r = memcmp(x->addr, y->addr, x->addr_len);

        if (r > 0) {
            ret = true;
        }
        else if (r == 0) {
            size_t tld_len = x->tld_len;
            if (y->tld_len < x->tld_len) {
                tld_len = y->tld_len;
            }
            r = memcmp(x->tld, y->tld, tld_len);
            if (r > 0) {
                ret = true;
            }
            else if (r == 0) {
                ret = x->tld_len > y->tld_len;
            }
        }
    }

    return ret;
}